

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

string * __thiscall
CRPCTable::help(string *__return_storage_ptr__,CRPCTable *this,string *strCommand,
               JSONRPCRequest *helpreq)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pUVar2;
  CRPCCommand *this_00;
  pointer pcVar3;
  long lVar4;
  pointer ppVar5;
  int iVar6;
  _Base_ptr p_Var7;
  undefined8 uVar8;
  ulong uVar9;
  UniValue *args;
  pointer ppVar10;
  _Rb_tree_header *p_Var11;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<long>,_bool> pVar12;
  size_type __size;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  vCommands;
  string strMethod;
  UniValue unused_result;
  set<long,_std::less<long>,_std::allocator<long>_> setDone;
  string category;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  local_2f8;
  UniValue local_2d9;
  undefined1 local_258 [32];
  undefined1 local_238 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  vector<UniValue,_std::allocator<UniValue>_> vStack_1f8;
  undefined1 local_1e0 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  VType local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  pointer local_138;
  pointer pUStack_130;
  pointer local_128;
  pointer local_120;
  pointer pUStack_118;
  pointer local_110;
  Mode local_108;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_88;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_58 = &local_48;
  local_50 = 0;
  local_48 = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ::reserve(&local_2f8,(this->mapCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var7 = (this->mapCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(this->mapCommands)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var11) {
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     **(undefined8 **)(p_Var7 + 2),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var7 + 1));
      std::
      vector<std::pair<std::__cxx11::string,CRPCCommand_const*>,std::allocator<std::pair<std::__cxx11::string,CRPCCommand_const*>>>
      ::emplace_back<std::__cxx11::string,CRPCCommand_const*const&>
                ((vector<std::pair<std::__cxx11::string,CRPCCommand_const*>,std::allocator<std::pair<std::__cxx11::string,CRPCCommand_const*>>>
                  *)&local_2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                 *(CRPCCommand ***)(p_Var7 + 2));
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var11);
  }
  ppVar10 = local_2f8.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppVar5 = local_2f8.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_2f8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2f8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar9 = ((long)local_2f8.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_2f8.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    lVar4 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,CRPCCommand_const*>*,std::vector<std::pair<std::__cxx11::string,CRPCCommand_const*>,std::allocator<std::pair<std::__cxx11::string,CRPCCommand_const*>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_2f8.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_2f8.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,CRPCCommand_const*>*,std::vector<std::pair<std::__cxx11::string,CRPCCommand_const*>,std::allocator<std::pair<std::__cxx11::string,CRPCCommand_const*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar5,ppVar10);
  }
  JSONRPCRequest::JSONRPCRequest((JSONRPCRequest *)local_1e0,helpreq);
  local_108 = GET_HELP;
  local_238._8_8_ = &local_220;
  local_238._16_8_ = 0;
  local_220._M_local_buf[0] = '\0';
  local_238._0_4_ = VNULL;
  local_210.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_210.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_210.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_1f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vStack_1f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  vStack_1f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (UniValue *)0x0;
  local_160 = VNULL;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_158,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_238 + 8));
  local_258._16_8_ = local_128;
  local_258._8_8_ = pUStack_130;
  local_258._0_8_ = local_138;
  local_138 = (pointer)local_210.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  pUStack_130 = (pointer)local_210.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
  local_128 = (pointer)local_210.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_210.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_210.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_210.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_258);
  local_258._16_8_ = local_110;
  local_258._8_8_ = pUStack_118;
  local_258._0_8_ = local_120;
  args = vStack_1f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  local_120 = vStack_1f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start;
  pUStack_118 = vStack_1f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_110 = vStack_1f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  vStack_1f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vStack_1f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  vStack_1f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_258);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._8_8_ != &local_220) {
    operator_delete((void *)local_238._8_8_,
                    CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) + 1);
  }
  ppVar5 = local_2f8.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_2f8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2f8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pUVar2 = (pointer)(local_258 + 0x10);
    ppVar10 = local_2f8.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = ppVar10->second;
      pcVar3 = (this_00->name)._M_dataplus._M_p;
      local_258._0_8_ = pUVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_258,pcVar3,pcVar3 + (this_00->name)._M_string_length);
      iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(strCommand,"");
      if (((iVar6 == 0) &&
          (iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare(&this_00->category,"hidden"), iVar6 != 0)) ||
         (((pointer)local_258._8_8_ == (pointer)strCommand->_M_string_length &&
          (((pointer)local_258._8_8_ == (pointer)0x0 ||
           (iVar6 = bcmp((void *)local_258._0_8_,(strCommand->_M_dataplus)._M_p,local_258._8_8_),
           iVar6 == 0)))))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258);
        local_238._8_8_ = &local_220;
        local_238._16_8_ = 0;
        local_220._M_local_buf[0] = '\0';
        local_238._0_4_ = VNULL;
        vStack_1f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_1f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_210.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_1f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_210.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_210.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pVar12 = std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                 ::_M_insert_unique<long_const&>
                           ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                             *)&local_88,&this_00->unique_id);
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_2d9.typ._0_1_ = VOBJ;
          if ((this_00->actor).super__Function_base._M_manager == (_Manager_type)0x0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar8 = std::__throw_bad_function_call();
              if ((undefined1 *)CONCAT44(local_238._4_4_,local_238._0_4_) != local_238 + 0x10) {
                operator_delete((undefined1 *)CONCAT44(local_238._4_4_,local_238._0_4_),
                                local_238._16_8_ + 1);
              }
              __cxa_end_catch();
              if ((pointer)local_258._0_8_ != pUVar2) {
                operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
              }
              JSONRPCRequest::~JSONRPCRequest((JSONRPCRequest *)local_1e0);
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
              ::~vector(&local_2f8);
              std::
              _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
              ~_Rb_tree(&local_88);
              if (local_58 != &local_48) {
                operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
              }
              pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3 != paVar1) {
                operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
              }
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar8);
              }
            }
            goto LAB_003bb519;
          }
          args = &local_2d9;
          (*(this_00->actor)._M_invoker)
                    ((_Any_data *)&this_00->actor,(JSONRPCRequest *)local_1e0,(UniValue *)local_238,
                     (bool *)args);
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_1f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._8_8_ != &local_220) {
          operator_delete((void *)local_238._8_8_,
                          CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0])
                          + 1);
        }
      }
      if ((pointer)local_258._0_8_ != pUVar2) {
        operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
      }
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 != ppVar5);
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (__return_storage_ptr__,"");
  if (iVar6 == 0) {
    tinyformat::format<std::__cxx11::string>
              ((string *)local_238,(tinyformat *)"help: unknown command: %s\n",(char *)strCommand,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    if ((undefined1 *)CONCAT44(local_238._4_4_,local_238._0_4_) != local_238 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_238._4_4_,local_238._0_4_),local_238._16_8_ + 1);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
             __return_storage_ptr__,0,__return_storage_ptr__->_M_string_length - 1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
  if ((undefined1 *)CONCAT44(local_238._4_4_,local_238._0_4_) != local_238 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_238._4_4_,local_238._0_4_),local_238._16_8_ + 1);
  }
  JSONRPCRequest::~JSONRPCRequest((JSONRPCRequest *)local_1e0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ::~vector(&local_2f8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_88);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_003bb519:
  __stack_chk_fail();
}

Assistant:

std::string CRPCTable::help(const std::string& strCommand, const JSONRPCRequest& helpreq) const
{
    std::string strRet;
    std::string category;
    std::set<intptr_t> setDone;
    std::vector<std::pair<std::string, const CRPCCommand*> > vCommands;
    vCommands.reserve(mapCommands.size());

    for (const auto& entry : mapCommands)
        vCommands.emplace_back(entry.second.front()->category + entry.first, entry.second.front());
    sort(vCommands.begin(), vCommands.end());

    JSONRPCRequest jreq = helpreq;
    jreq.mode = JSONRPCRequest::GET_HELP;
    jreq.params = UniValue();

    for (const std::pair<std::string, const CRPCCommand*>& command : vCommands)
    {
        const CRPCCommand *pcmd = command.second;
        std::string strMethod = pcmd->name;
        if ((strCommand != "" || pcmd->category == "hidden") && strMethod != strCommand)
            continue;
        jreq.strMethod = strMethod;
        try
        {
            UniValue unused_result;
            if (setDone.insert(pcmd->unique_id).second)
                pcmd->actor(jreq, unused_result, /*last_handler=*/true);
        }
        catch (const std::exception& e)
        {
            // Help text is returned in an exception
            std::string strHelp = std::string(e.what());
            if (strCommand == "")
            {
                if (strHelp.find('\n') != std::string::npos)
                    strHelp = strHelp.substr(0, strHelp.find('\n'));

                if (category != pcmd->category)
                {
                    if (!category.empty())
                        strRet += "\n";
                    category = pcmd->category;
                    strRet += "== " + Capitalize(category) + " ==\n";
                }
            }
            strRet += strHelp + "\n";
        }
    }
    if (strRet == "")
        strRet = strprintf("help: unknown command: %s\n", strCommand);
    strRet = strRet.substr(0,strRet.size()-1);
    return strRet;
}